

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O3

void idx2::InverseCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  bool bVar1;
  int iVar2;
  undefined1 *puVar3;
  double *pdVar4;
  char *__function;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  u64 TransformOrder;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  grid *pgVar12;
  int iVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  grid_iterator<signed_char> It;
  v3i R3;
  v3i D3;
  v3i S3;
  grid_iterator<signed_char> ItEnd;
  stack_array<int,_32> StackAxes;
  wav_basis_norms_static<16> BasisNorms;
  stack_array<idx2::grid,_32> StackGrids;
  grid_iterator<double> local_5a8;
  double local_570;
  ulong local_568;
  uint local_560;
  ulong local_558;
  uint local_550;
  ulong local_54c;
  uint local_544;
  grid_iterator<double> local_540;
  array<idx2::subband> local_508;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458;
  undefined1 local_448 [136];
  undefined1 local_3c0 [112];
  grid gStack_350;
  ulong local_338 [97];
  
  iVar13 = 0;
  memset(local_338,0,0x301);
  auVar16 = ZEXT816(0) << 0x40;
  local_478 = ZEXT1632(auVar16);
  local_498 = ZEXT1632(auVar16);
  local_4b8 = ZEXT1632(auVar16);
  local_4d8 = ZEXT1632(auVar16);
  local_458 = 0;
  local_550 = (Dims3->field_0).field_0.Z;
  local_558 = *(ulong *)&Dims3->field_0;
  local_560 = (Dims3->field_0).field_0.Z;
  local_568 = *(ulong *)&Dims3->field_0;
  local_54c = 0x100000001;
  local_544 = 1;
  if (0 < NLevels) {
    local_570 = (double)CONCAT44(local_570._4_4_,Iter);
    uVar7 = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
            (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff |
            ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15;
    uVar6 = 0x40000200001;
    uVar9 = 0;
    TransformOrder = TformOrder;
    do {
      uVar10 = (uint)TransformOrder;
      uVar8 = uVar10 & 3;
      TransformOrder = TransformOrder >> 2;
      if (uVar8 == 3) {
        if (TransformOrder != 3) {
          TformOrder = TransformOrder;
        }
        uVar6 = (ulong)(local_544 & 0x1fffff) << 0x2a |
                (local_54c >> 0x20 & 0x1fffff) << 0x15 | local_54c & 0x1fffff;
        local_560 = local_550;
        uVar7 = (ulong)(local_550 & 0x1fffff) << 0x2a |
                (local_558 >> 0x20 & 0x1fffff) << 0x15 | local_558 & 0x1fffff;
        local_568 = local_558;
        iVar13 = iVar13 + 1;
        TransformOrder = TformOrder;
      }
      else {
        if (0x1f < (int)uVar9) {
          __function = 
          "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]";
          goto LAB_0018cf11;
        }
        lVar14 = (long)(int)uVar9;
        local_338[lVar14 * 3] = 0;
        local_338[lVar14 * 3 + 1] = uVar7;
        local_338[lVar14 * 3 + 2] = uVar6;
        uVar9 = uVar9 + 1;
        *(uint *)(local_4d8 + lVar14 * 4) = uVar8;
        uVar11 = (ulong)((uVar10 & 3) << 2);
        uVar8 = *(uint *)((long)&local_558 + uVar11) | 1;
        *(uint *)((long)&local_568 + uVar11) = uVar8;
        uVar7 = (ulong)(local_560 & 0x1fffff) << 0x2a |
                (local_568 >> 0x20 & 0x1fffff) << 0x15 | local_568 & 0x1fffff;
        *(int *)((long)&local_54c + uVar11) = *(int *)((long)&local_54c + uVar11) << 1;
        *(int *)((long)&local_558 + uVar11) = (int)(uVar8 + 1) >> 1;
      }
    } while (iVar13 < NLevels);
    if (Normalize && 0 < NLevels) {
      if (Mallocator()::Instance == '\0') {
        InverseCdf53();
      }
      if (Mallocator()::Instance == '\0') {
        InverseCdf53();
      }
      local_508.Buffer.Data = (byte *)0x0;
      local_508.Buffer.Bytes = 0;
      local_508.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
      local_508.Size = 0;
      local_508.Capacity = 0;
      local_508.Alloc = (allocator *)&Mallocator()::Instance;
      BuildSubbands(Dims3,NLevels,TransformOrder,&local_508);
      GetCdf53NormsFast<16>();
      if (0 < local_508.Size) {
        iVar13 = NLevels * local_570._0_4_;
        lVar14 = 0;
        do {
          dVar15 = 1.0;
          pgVar12 = (grid *)(local_508.Buffer.Data + lVar14 * 0x40);
          if ((Dims3->field_0).field_0.X != 1) {
            iVar2 = *(char *)((long)&pgVar12[2].super_extent.From + 3) + iVar13;
            if (*(char *)((long)&pgVar12[2].super_extent.From + 6) == '\0') {
              if (iVar2 < 0x11) {
                iVar2 = iVar2 + -1;
                puVar3 = local_448;
                goto LAB_0018c515;
              }
            }
            else {
              puVar3 = local_3c0;
              if (iVar2 < 0x10) {
LAB_0018c515:
                dVar15 = *(double *)(puVar3 + (long)iVar2 * 8);
                goto LAB_0018c51c;
              }
            }
            goto LAB_0018cefc;
          }
LAB_0018c51c:
          dVar17 = 1.0;
          if ((Dims3->field_0).field_0.Y != 1) {
            iVar2 = *(char *)((long)&pgVar12[2].super_extent.From + 4) + iVar13;
            if (*(char *)((long)&pgVar12[2].super_extent.From + 7) == '\0') {
              if (iVar2 < 0x11) {
                iVar2 = iVar2 + -1;
                puVar3 = local_448;
                goto LAB_0018c55e;
              }
            }
            else {
              puVar3 = local_3c0;
              if (iVar2 < 0x10) {
LAB_0018c55e:
                dVar17 = *(double *)(puVar3 + (long)iVar2 * 8);
                goto LAB_0018c565;
              }
            }
            goto LAB_0018cefc;
          }
LAB_0018c565:
          dVar18 = 1.0;
          if ((Dims3->field_0).field_0.Z != 1) {
            iVar2 = *(char *)((long)&pgVar12[2].super_extent.From + 5) + iVar13;
            if ((char)pgVar12[2].super_extent.Dims == '\0') {
              if (iVar2 < 0x11) {
                iVar2 = iVar2 + -1;
                puVar3 = local_448;
                goto LAB_0018c5a7;
              }
            }
            else {
              puVar3 = local_3c0;
              if (iVar2 < 0x10) {
LAB_0018c5a7:
                dVar18 = *(double *)(puVar3 + (long)iVar2 * 8);
                goto LAB_0018c5ae;
              }
            }
LAB_0018cefc:
            __function = 
            "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
            goto LAB_0018cf11;
          }
LAB_0018c5ae:
          if (Vol->Type < __Invalid__) {
            local_570 = 1.0 / (dVar15 * dVar17 * dVar18);
            switch(Vol->Type) {
            case int8:
              End<signed_char>((grid_iterator<signed_char> *)&local_540,pgVar12,Vol);
              Begin<signed_char>((grid_iterator<signed_char> *)&local_5a8,pgVar12,Vol);
              while (local_5a8.Ptr != local_540.Ptr) {
                *(char *)local_5a8.Ptr =
                     (char)(int)((double)(int)*(char *)local_5a8.Ptr * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                local_5a8.Ptr =
                     (double *)((long)local_5a8.S.field_0.field_0.X + (long)local_5a8.Ptr);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  local_5a8.Ptr =
                       (double *)
                       ((long)local_5a8.Ptr +
                       (local_5a8.S.field_0.field_0.Y * lVar5 - (long)local_5a8.D.field_0.field_0.X)
                       );
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    local_5a8.Ptr =
                         (double *)
                         ((long)local_5a8.Ptr +
                         ((long)local_5a8.N.field_0.field_0.Y *
                          local_5a8.S.field_0.field_0.Z * lVar5 -
                         local_5a8.D.field_0.field_0.Y * lVar5));
                  }
                }
              }
              break;
            case uint8:
              End<unsigned_char>((grid_iterator<unsigned_char> *)&local_540,pgVar12,Vol);
              Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_5a8,pgVar12,Vol);
              while (local_5a8.Ptr != local_540.Ptr) {
                *(char *)local_5a8.Ptr = (char)(int)((double)*(byte *)local_5a8.Ptr * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                local_5a8.Ptr =
                     (double *)((long)local_5a8.S.field_0.field_0.X + (long)local_5a8.Ptr);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  local_5a8.Ptr =
                       (double *)
                       ((long)local_5a8.Ptr +
                       (local_5a8.S.field_0.field_0.Y * lVar5 - (long)local_5a8.D.field_0.field_0.X)
                       );
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    local_5a8.Ptr =
                         (double *)
                         ((long)local_5a8.Ptr +
                         ((long)local_5a8.N.field_0.field_0.Y *
                          local_5a8.S.field_0.field_0.Z * lVar5 -
                         local_5a8.D.field_0.field_0.Y * lVar5));
                  }
                }
              }
              break;
            case int16:
              End<short>((grid_iterator<short> *)&local_540,pgVar12,Vol);
              Begin<short>((grid_iterator<short> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *(short *)pdVar4 = (short)(int)((double)(int)*(short *)pdVar4 * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = (double *)((long)pdVar4 + (long)local_5a8.S.field_0.field_0.X * 2);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = (double *)
                           ((long)pdVar4 +
                           local_5a8.S.field_0.field_0.Y * lVar5 * 2 +
                           (long)local_5a8.D.field_0.field_0.X * -2);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = (double *)
                             ((long)pdVar4 +
                             (long)local_5a8.N.field_0.field_0.Y *
                             local_5a8.S.field_0.field_0.Z * lVar5 * 2 +
                             local_5a8.D.field_0.field_0.Y * lVar5 * -2);
                  }
                }
              }
              break;
            case uint16:
              End<unsigned_short>((grid_iterator<unsigned_short> *)&local_540,pgVar12,Vol);
              Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *(short *)pdVar4 = (short)(int)((double)*(ushort *)pdVar4 * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = (double *)((long)pdVar4 + (long)local_5a8.S.field_0.field_0.X * 2);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = (double *)
                           ((long)pdVar4 +
                           local_5a8.S.field_0.field_0.Y * lVar5 * 2 +
                           (long)local_5a8.D.field_0.field_0.X * -2);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = (double *)
                             ((long)pdVar4 +
                             (long)local_5a8.N.field_0.field_0.Y *
                             local_5a8.S.field_0.field_0.Z * lVar5 * 2 +
                             local_5a8.D.field_0.field_0.Y * lVar5 * -2);
                  }
                }
              }
              break;
            case int32:
              End<int>((grid_iterator<int> *)&local_540,pgVar12,Vol);
              Begin<int>((grid_iterator<int> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *(int *)pdVar4 = (int)((double)(int)*(float *)pdVar4 * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = (double *)((long)pdVar4 + (long)local_5a8.S.field_0.field_0.X * 4);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = (double *)
                           ((long)pdVar4 +
                           local_5a8.S.field_0.field_0.Y * lVar5 * 4 +
                           (long)local_5a8.D.field_0.field_0.X * -4);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = (double *)
                             ((long)pdVar4 +
                             (long)local_5a8.N.field_0.field_0.Y *
                             local_5a8.S.field_0.field_0.Z * lVar5 * 4 +
                             local_5a8.D.field_0.field_0.Y * lVar5 * -4);
                  }
                }
              }
              break;
            case uint32:
              End<unsigned_int>((grid_iterator<unsigned_int> *)&local_540,pgVar12,Vol);
              Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *(float *)pdVar4 = (float)(long)((double)(uint)*(float *)pdVar4 * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = (double *)((long)pdVar4 + (long)local_5a8.S.field_0.field_0.X * 4);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = (double *)
                           ((long)pdVar4 +
                           local_5a8.S.field_0.field_0.Y * lVar5 * 4 +
                           (long)local_5a8.D.field_0.field_0.X * -4);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = (double *)
                             ((long)pdVar4 +
                             (long)local_5a8.N.field_0.field_0.Y *
                             local_5a8.S.field_0.field_0.Z * lVar5 * 4 +
                             local_5a8.D.field_0.field_0.Y * lVar5 * -4);
                  }
                }
              }
              break;
            case int64:
              End<long>((grid_iterator<long> *)&local_540,pgVar12,Vol);
              Begin<long>((grid_iterator<long> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *pdVar4 = (double)(long)((double)(long)*pdVar4 * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = pdVar4 + local_5a8.S.field_0.field_0.X;
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = pdVar4 + (local_5a8.S.field_0.field_0.Y * lVar5 -
                                    (long)local_5a8.D.field_0.field_0.X);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = pdVar4 + ((long)local_5a8.N.field_0.field_0.Y *
                                       local_5a8.S.field_0.field_0.Z * lVar5 -
                                      local_5a8.D.field_0.field_0.Y * lVar5);
                  }
                }
              }
              break;
            case uint64:
              End<unsigned_long>((grid_iterator<unsigned_long> *)&local_540,pgVar12,Vol);
              Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = *pdVar4;
                auVar16 = vunpcklps_avx(auVar16,_DAT_001a8f60);
                auVar16 = vsubpd_avx(auVar16,_DAT_001a8f70);
                dVar15 = (auVar16._0_8_ + auVar16._8_8_) * local_570;
                uVar6 = (ulong)dVar15;
                *pdVar4 = (double)((long)(dVar15 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f |
                                  uVar6);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = pdVar4 + local_5a8.S.field_0.field_0.X;
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = pdVar4 + (local_5a8.S.field_0.field_0.Y * lVar5 -
                                    (long)local_5a8.D.field_0.field_0.X);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = pdVar4 + ((long)local_5a8.N.field_0.field_0.Y *
                                       local_5a8.S.field_0.field_0.Z * lVar5 -
                                      local_5a8.D.field_0.field_0.Y * lVar5);
                  }
                }
              }
              break;
            case float32:
              End<float>((grid_iterator<float> *)&local_540,pgVar12,Vol);
              Begin<float>((grid_iterator<float> *)&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *(float *)pdVar4 = (float)((double)*(float *)pdVar4 * local_570);
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = (double *)((long)pdVar4 + (long)local_5a8.S.field_0.field_0.X * 4);
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = (double *)
                           ((long)pdVar4 +
                           local_5a8.S.field_0.field_0.Y * lVar5 * 4 +
                           (long)local_5a8.D.field_0.field_0.X * -4);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = (double *)
                             ((long)pdVar4 +
                             (long)local_5a8.N.field_0.field_0.Y *
                             local_5a8.S.field_0.field_0.Z * lVar5 * 4 +
                             local_5a8.D.field_0.field_0.Y * lVar5 * -4);
                  }
                }
              }
              break;
            case float64:
              End<double>(&local_540,pgVar12,Vol);
              Begin<double>(&local_5a8,pgVar12,Vol);
              pdVar4 = local_5a8.Ptr;
              while (pdVar4 != local_540.Ptr) {
                *pdVar4 = local_570 * *pdVar4;
                local_5a8.P.field_0.field_0.X =
                     local_5a8.P.field_0.field_0.X + local_5a8.S.field_0.field_0.X;
                pdVar4 = pdVar4 + local_5a8.S.field_0.field_0.X;
                if (local_5a8.D.field_0.field_0.X <= local_5a8.P.field_0.field_0.X) {
                  local_5a8.P.field_0.field_0.X = 0;
                  local_5a8.P.field_0.field_0.Y =
                       local_5a8.P.field_0.field_0.Y + local_5a8.S.field_0.field_0.Y;
                  lVar5 = (long)local_5a8.N.field_0.field_0.X;
                  pdVar4 = pdVar4 + (local_5a8.S.field_0.field_0.Y * lVar5 -
                                    (long)local_5a8.D.field_0.field_0.X);
                  if (local_5a8.D.field_0.field_0.Y <= local_5a8.P.field_0.field_0.Y) {
                    local_5a8.P.field_0.field_0.Y = 0;
                    local_5a8.P.field_0.field_0.Z =
                         local_5a8.P.field_0.field_0.Z + local_5a8.S.field_0.field_0.Z;
                    pdVar4 = pdVar4 + ((long)local_5a8.N.field_0.field_0.Y *
                                       local_5a8.S.field_0.field_0.Z * lVar5 -
                                      local_5a8.D.field_0.field_0.Y * lVar5);
                  }
                }
              }
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_508.Size);
      }
      (*(local_508.Alloc)->_vptr_allocator[1])();
    }
    if (0 < (int)uVar9) {
      pgVar12 = &gStack_350 + uVar9;
      uVar6 = (ulong)uVar9;
      do {
        if (0x20 < uVar6) {
          __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
LAB_0018cf11:
          __assert_fail("Idx < N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x20c,__function);
        }
        if (Vol->Type < __Invalid__) {
          iVar13 = *(int *)(local_4d8 + uVar6 * 4 + -4);
          if (iVar13 == 2) {
            ILiftCdf53Z<double>(pgVar12,M3,Normal,Vol);
          }
          else if (iVar13 == 1) {
            ILiftCdf53Y<double>(pgVar12,M3,Normal,Vol);
          }
          else if (iVar13 == 0) {
            ILiftCdf53X<double>(pgVar12,M3,Normal,Vol);
          }
        }
        pgVar12 = pgVar12 + -1;
        bVar1 = 1 < uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void
InverseCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  /* "simulate" the forward transform */
  stack_array<grid, 32> StackGrids;
  stack_array<int, 32> StackAxes;
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int Iteration = 0;
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
      StackGrids[Iteration] = G;
      StackAxes[Iteration++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* inverse normalize if required */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }

  /* perform the inverse transform */
  while (Iteration-- > 0)
  {
    int D = StackAxes[Iteration];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(StackGrids[Iteration], M3, lift_option::Normal, Vol);                       \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}